

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_peer.cpp
# Opt level: O3

list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_> * __thiscall
udpdiscovery::Peer::ListDiscovered_abi_cxx11_
          (list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>
           *__return_storage_ptr__,Peer *this)

{
  _List_base<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_> local_28;
  
  (__return_storage_ptr__->
  super__List_base<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>).
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>).
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>).
  _M_impl._M_node._M_size = 0;
  if (this->env_ != (PeerEnvInterface *)0x0) {
    (*this->env_->_vptr_PeerEnvInterface[3])(&local_28);
    if (&local_28 !=
        &__return_storage_ptr__->
         super__List_base<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>
       ) {
      std::__cxx11::list<udpdiscovery::DiscoveredPeer,std::allocator<udpdiscovery::DiscoveredPeer>>
      ::_M_assign_dispatch<std::_List_const_iterator<udpdiscovery::DiscoveredPeer>>
                ((list<udpdiscovery::DiscoveredPeer,std::allocator<udpdiscovery::DiscoveredPeer>> *)
                 __return_storage_ptr__,local_28._M_impl._M_node.super__List_node_base._M_next);
    }
    std::__cxx11::
    _List_base<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>::
    _M_clear(&local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

std::list<DiscoveredPeer> Peer::ListDiscovered() const {
  std::list<DiscoveredPeer> result;
  if (env_) {
    result = env_->ListDiscovered();
  }
  return result;
}